

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O2

void JSONErrorReply(HTTPRequest *req,UniValue *objError,JSONRPCRequest *jreq)

{
  long lVar1;
  int iVar2;
  UniValue *this;
  int iVar3;
  int nStatus;
  long in_FS_OFFSET;
  string_view key;
  UniValue in_stack_fffffffffffffe28;
  UniValue in_stack_fffffffffffffe80;
  _Optional_payload_base<UniValue> in_stack_fffffffffffffed8;
  UniValue local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string strReply;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key._M_str = "code";
  key._M_len = 4;
  this = UniValue::find_value(objError,key);
  iVar2 = UniValue::getInt<int>(this);
  iVar3 = 500;
  if (iVar2 == -0x7f59) {
    iVar3 = 0x194;
  }
  nStatus = 400;
  if (iVar2 != -0x7f58) {
    nStatus = iVar3;
  }
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffee8,&NullUniValue);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffe90,objError);
  std::_Optional_base<UniValue,_false,_false>::_Optional_base
            ((_Optional_base<UniValue,_false,_false> *)&stack0xfffffffffffffe30,
             (_Optional_base<UniValue,_false,_false> *)jreq);
  JSONRPCReplyObj(&local_c0,in_stack_fffffffffffffe28,in_stack_fffffffffffffe80,
                  (optional<UniValue>)in_stack_fffffffffffffed8,
                  (JSONRPCVersion)&stack0xfffffffffffffee8);
  UniValue::write_abi_cxx11_((UniValue *)&local_68,(int)&local_c0,(void *)0x0,0);
  std::operator+(&strReply,&local_68,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  UniValue::~UniValue(&local_c0);
  std::_Optional_payload_base<UniValue>::_M_reset
            ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffe30);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffe90);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffee8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Content-Type",(allocator<char> *)&stack0xfffffffffffffe2f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"application/json",(allocator<char> *)&stack0xfffffffffffffe2e);
  HTTPRequest::WriteHeader(req,(string *)&local_c0,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  HTTPRequest::WriteReply
            (req,nStatus,(span<const_std::byte,_18446744073709551615UL>)strReply._0_16_);
  std::__cxx11::string::~string((string *)&strReply);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void JSONErrorReply(HTTPRequest* req, UniValue objError, const JSONRPCRequest& jreq)
{
    // Sending HTTP errors is a legacy JSON-RPC behavior.
    Assume(jreq.m_json_version != JSONRPCVersion::V2);

    // Send error reply from json-rpc error object
    int nStatus = HTTP_INTERNAL_SERVER_ERROR;
    int code = objError.find_value("code").getInt<int>();

    if (code == RPC_INVALID_REQUEST)
        nStatus = HTTP_BAD_REQUEST;
    else if (code == RPC_METHOD_NOT_FOUND)
        nStatus = HTTP_NOT_FOUND;

    std::string strReply = JSONRPCReplyObj(NullUniValue, std::move(objError), jreq.id, jreq.m_json_version).write() + "\n";

    req->WriteHeader("Content-Type", "application/json");
    req->WriteReply(nStatus, strReply);
}